

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

void amqpvalue_decoder_destroy(AMQPVALUE_DECODER_HANDLE handle)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (handle != (AMQPVALUE_DECODER_HANDLE)0x0) {
    amqpvalue_destroy(handle->internal_decoder->decode_to_value);
    internal_decoder_destroy(handle->internal_decoder);
    free(handle);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
               ,"amqpvalue_decoder_destroy",0x1bbf,1,"NULL handle");
    return;
  }
  return;
}

Assistant:

void amqpvalue_decoder_destroy(AMQPVALUE_DECODER_HANDLE handle)
{
    if (handle == NULL)
    {
        /* Codes_SRS_AMQPVALUE_01_317: [If handle is NULL, amqpvalue_decoder_destroy shall do nothing.] */
        LogError("NULL handle");
    }
    else
    {
        AMQPVALUE_DECODER_HANDLE_DATA* decoder_instance = (AMQPVALUE_DECODER_HANDLE_DATA*)handle;
        /* Codes_SRS_AMQPVALUE_01_316: [amqpvalue_decoder_destroy shall free all resources associated with the amqpvalue_decoder.] */
        amqpvalue_destroy(decoder_instance->internal_decoder->decode_to_value);
        internal_decoder_destroy(decoder_instance->internal_decoder);
        free(handle);
    }
}